

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_free.c
# Opt level: O0

void lyd_free_leafref_nodes(lyd_node_term *node)

{
  LY_ERR LVar1;
  long local_30;
  lyd_leafref_links_rec *local_28;
  lyd_leafref_links_rec *rec;
  ly_ht *plStack_18;
  uint32_t hash;
  ly_ht *ht;
  lyd_node_term *node_local;
  
  ht = (ly_ht *)node;
  if (node == (lyd_node_term *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_free.c"
                  ,0xb6,"void lyd_free_leafref_nodes(const struct lyd_node_term *)");
  }
  LVar1 = lyd_get_or_create_leafref_links_record(node,&local_28,'\0');
  if (LVar1 == LY_SUCCESS) {
    lyd_free_leafref_links_rec(local_28);
    if (ht->val_equal == (lyht_value_equal_cb)0x0) {
      local_30._0_2_ = ht[2].resize;
      local_30._2_2_ = ht[2].rec_size;
      local_30._4_4_ = ht[2].first_free_rec;
    }
    else {
      local_30 = **(long **)(ht->val_equal + 8);
    }
    plStack_18 = *(ly_ht **)(local_30 + 0x148);
    rec._4_4_ = lyht_hash((char *)&ht,8);
    lyht_remove(plStack_18,local_28,rec._4_4_);
  }
  return;
}

Assistant:

void
lyd_free_leafref_nodes(const struct lyd_node_term *node)
{
    struct ly_ht *ht;
    uint32_t hash;
    struct lyd_leafref_links_rec *rec;

    assert(node);

    if (lyd_get_or_create_leafref_links_record(node, &rec, 0)) {
        return;
    }

    /* free entry content */
    lyd_free_leafref_links_rec(rec);

    /* free entry itself from hash table */
    ht = LYD_CTX(node)->leafref_links_ht;
    hash = lyht_hash((const char *)&node, sizeof node);
    lyht_remove(ht, rec, hash);
}